

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

axbStatus_t axbMemBackendRegister_Host(axbHandle_s *handle)

{
  axbMemBackend_s *in_RAX;
  axbMemBackend_s *host_backend;
  axbMemBackend_s *local_18;
  
  local_18 = in_RAX;
  axbMemBackendCreate(&local_18);
  axbMemBackendSetName(local_18,"host");
  axbMemBackendSetMalloc(local_18,host_malloc);
  axbMemBackendSetFree(local_18,host_free);
  axbMemBackendSetCopyIn(local_18,host_copyin);
  axbMemBackendSetCopyOut(local_18,host_copyout);
  axbMemBackendRegister(handle,local_18);
  return 0;
}

Assistant:

axbStatus_t axbMemBackendRegister_Host(struct axbHandle_s *handle)
{
  struct axbMemBackend_s *host_backend;
  axbMemBackendCreate(&host_backend);

  // populate host_backend:
  axbMemBackendSetName(host_backend, "host");
  axbMemBackendSetMalloc(host_backend, host_malloc);
  axbMemBackendSetFree(host_backend, host_free);

  axbMemBackendSetCopyIn(host_backend, host_copyin);
  axbMemBackendSetCopyOut(host_backend, host_copyout);

  // push into enclosing context identified by handle:
  axbMemBackendRegister(handle, host_backend);
  return 0;
}